

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockNamedValueTest.cpp
# Opt level: O3

void __thiscall
TEST_MockNamedValue_DoublesNotEqualIfOutsideTolerance_Test::testBody
          (TEST_MockNamedValue_DoublesNotEqualIfOutsideTolerance_Test *this)

{
  MockNamedValue *pMVar1;
  int iVar2;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  SimpleString local_70;
  MockNamedValue other;
  
  (*((this->super_TEST_GROUP_CppUTestGroupMockNamedValue).value)->_vptr_MockNamedValue[10])
            (0x4014000000000000,0x3fd999999999999a);
  SimpleString::SimpleString(&local_70,"param2");
  MockNamedValue::MockNamedValue(&other,&local_70);
  SimpleString::~SimpleString(&local_70);
  MockNamedValue::setValue(&other,5.5);
  pUVar3 = UtestShell::getCurrent();
  pMVar1 = (this->super_TEST_GROUP_CppUTestGroupMockNamedValue).value;
  iVar2 = (*pMVar1->_vptr_MockNamedValue[0x14])(pMVar1,&other);
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[8])
            (pUVar3,(ulong)(byte)((byte)iVar2 ^ 1),"CHECK_FALSE","value->equals(other)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockNamedValueTest.cpp"
             ,0x8c,pTVar4);
  MockNamedValue::~MockNamedValue(&other);
  return;
}

Assistant:

TEST(MockNamedValue, DoublesNotEqualIfOutsideTolerance)
{
  value->setValue(5.0, 0.4);
  MockNamedValue other("param2");
  other.setValue(5.5);

  CHECK_FALSE(value->equals(other));
}